

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

timestamp_t __thiscall AnalogConsumer::getData(AnalogConsumer *this,int16_t *dest)

{
  int16_t iVar1;
  pointer puVar2;
  uint *puVar3;
  pointer piVar4;
  pointer piVar5;
  pointer psVar6;
  int iVar7;
  undefined4 extraout_var;
  int64_t iVar8;
  ulong uVar9;
  int iVar10;
  timestamp_t tVar11;
  
  puVar2 = (this->temp_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar7 = (*(this->super_HFSubConsumer).super_HighFreqSub._vptr_HighFreqSub[5])
                    (this,puVar2,
                     (long)(this->temp_buffer).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)puVar2);
  if (CONCAT44(extraout_var,iVar7) == 0) {
    uVar9 = 0;
    iVar8 = 0;
  }
  else {
    puVar3 = (uint *)(this->temp_buffer).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    piVar4 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar5 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->il_id_masks).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    psVar6 = (this->prev_interleaved).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar7 = this->il_byte_loc;
    iVar10 = 0;
    for (uVar9 = 0; ((long)piVar4 - (long)piVar5 >> 2) + 1U >> 1 != uVar9; uVar9 = uVar9 + 1) {
      if (piVar5[uVar9 * 2 + 1] == -1) {
        dest[uVar9] = *(int16_t *)((long)puVar3 + (long)piVar5[uVar9 * 2] + 4);
      }
      else {
        if ((puVar2[iVar10] & *(byte *)((long)puVar3 + (long)iVar7 + 4)) == 0) {
          dest[uVar9] = psVar6[iVar10];
        }
        else {
          iVar1 = *(int16_t *)((long)puVar3 + (long)piVar5[uVar9 * 2] + 4);
          dest[uVar9] = iVar1;
          psVar6[iVar10] = iVar1;
        }
        iVar10 = iVar10 + 1;
      }
    }
    uVar9 = (ulong)*puVar3;
    iVar8 = (this->super_HFSubConsumer).lasttimestamp;
  }
  tVar11.system_timestamp = iVar8;
  tVar11._0_8_ = uVar9;
  return tVar11;
}

Assistant:

timestamp_t AnalogConsumer::getData(int16_t *dest){
    if(!readData(temp_buffer.data(), temp_buffer.size())){
        return {0,0};
    }
    byte *src = (byte*)temp_buffer.data() + sizeof(uint32_t);
    int offset = 0;
    int il_i = 0;
    for(size_t i = 0; i < args.indices.size(); i += 2){
        int byt = args.indices[i];
        int bit = args.indices[i+1];
        if(bit == -1){
            //Non interleaved
            dest[offset] = *(int16_t*)(src+byt);
        }
        else{
            //Interleaved
            //Compare mask[il_i] and packet's il id byte
            if(il_id_masks[il_i] & src[il_byte_loc]){
                //If packet contains this type of data
                dest[offset] = *(int16_t*)(src+byt);
                prev_interleaved[il_i] = dest[offset];
            }
            else{
                //Else, use prev il data
                dest[offset] = prev_interleaved[il_i];
            }
            il_i++;
        }
        offset++;
    }
    return {*(uint32_t*)(temp_buffer.data()), lastSysTimestamp()}; //Timestamp at beginning of packet
}